

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_tga_core(stbi__write_context *s,int x,int y,int comp,void *data)

{
  uint write_alpha;
  int iVar1;
  uchar *d;
  int iVar2;
  ulong in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffee8;
  int local_a8;
  bool local_a3;
  uchar header_1;
  uchar *puStack_a0;
  uchar header;
  uchar *prev;
  int diff;
  uchar *begin;
  int len;
  uchar *row;
  int jdir;
  int jend;
  int k;
  int j;
  int i;
  int format;
  int colorbytes;
  int has_alpha;
  void *data_local;
  int comp_local;
  int y_local;
  int x_local;
  stbi__write_context *s_local;
  
  local_a3 = comp == 2 || comp == 4;
  write_alpha = (uint)local_a3;
  local_a8 = comp;
  if (write_alpha != 0) {
    local_a8 = comp + -1;
  }
  iVar2 = 2;
  if (local_a8 < 2) {
    iVar2 = 3;
  }
  if ((y < 0) || (x < 0)) {
    s_local._4_4_ = 0;
  }
  else if (stbi_write_tga_with_rle == 0) {
    s_local._4_4_ =
         stbiw__outfile(s,-1,-1,x,y,comp,0,data,write_alpha,0,"111 221 2222 11",0,0,iVar2,0,0,0,0,0,
                        x,y,(local_a8 + write_alpha) * 8,write_alpha << 3);
  }
  else {
    stbiw__writef(s,"111 221 2222 11",0,0,(ulong)(iVar2 + 8),0,0,
                  in_stack_fffffffffffffed0 & 0xffffffff00000000,0,0,
                  CONCAT44((int)((ulong)in_stack_fffffffffffffee8 >> 0x20),x),y,
                  (local_a8 + write_alpha) * 8,write_alpha << 3);
    if (stbi__flip_vertically_on_write == 0) {
      jend = y + -1;
      row._4_4_ = -1;
      row._0_4_ = -1;
    }
    else {
      jend = 0;
      row._0_4_ = 1;
      row._4_4_ = y;
    }
    for (; jend != row._4_4_; jend = (int)row + jend) {
      iVar2 = jend * x * comp;
      for (k = 0; k < x; k = begin._4_4_ + k) {
        d = (uchar *)((long)data + (long)(k * comp) + (long)iVar2);
        prev._4_4_ = 1;
        begin._4_4_ = 1;
        if (k < x + -1) {
          begin._4_4_ = 2;
          prev._4_4_ = memcmp(d,(void *)((long)data + (long)((k + 1) * comp) + (long)iVar2),
                              (long)comp);
          if (prev._4_4_ == 0) {
            jdir = k + 2;
            while ((jdir < x && begin._4_4_ < 0x80 &&
                   (iVar1 = memcmp(d,(void *)((long)data + (long)(jdir * comp) + (long)iVar2),
                                   (long)comp), iVar1 == 0))) {
              begin._4_4_ = begin._4_4_ + 1;
              jdir = jdir + 1;
            }
          }
          else {
            puStack_a0 = d;
            for (jdir = k + 2; jdir < x && begin._4_4_ < 0x80; jdir = jdir + 1) {
              iVar1 = memcmp(puStack_a0,(void *)((long)data + (long)(jdir * comp) + (long)iVar2),
                             (long)comp);
              if (iVar1 == 0) {
                begin._4_4_ = begin._4_4_ + -1;
                break;
              }
              puStack_a0 = puStack_a0 + comp;
              begin._4_4_ = begin._4_4_ + 1;
            }
          }
        }
        if (prev._4_4_ == 0) {
          stbiw__write1(s,(char)begin._4_4_ + '\x7f');
          stbiw__write_pixel(s,-1,comp,write_alpha,0,d);
        }
        else {
          stbiw__write1(s,(char)begin._4_4_ + 0xff);
          for (jdir = 0; jdir < begin._4_4_; jdir = jdir + 1) {
            stbiw__write_pixel(s,-1,comp,write_alpha,0,d + jdir * comp);
          }
        }
      }
    }
    stbiw__write_flush(s);
    s_local._4_4_ = 1;
  }
  return s_local._4_4_;
}

Assistant:

static int stbi_write_tga_core(stbi__write_context *s, int x, int y, int comp, void *data)
{
   int has_alpha = (comp == 2 || comp == 4);
   int colorbytes = has_alpha ? comp-1 : comp;
   int format = colorbytes < 2 ? 3 : 2; // 3 color channels (RGB/RGBA) = 2, 1 color channel (Y/YA) = 3

   if (y < 0 || x < 0)
      return 0;

   if (!stbi_write_tga_with_rle) {
      return stbiw__outfile(s, -1, -1, x, y, comp, 0, (void *) data, has_alpha, 0,
         "111 221 2222 11", 0, 0, format, 0, 0, 0, 0, 0, x, y, (colorbytes + has_alpha) * 8, has_alpha * 8);
   } else {
      int i,j,k;
      int jend, jdir;

      stbiw__writef(s, "111 221 2222 11", 0,0,format+8, 0,0,0, 0,0,x,y, (colorbytes + has_alpha) * 8, has_alpha * 8);

      if (stbi__flip_vertically_on_write) {
         j = 0;
         jend = y;
         jdir = 1;
      } else {
         j = y-1;
         jend = -1;
         jdir = -1;
      }
      for (; j != jend; j += jdir) {
         unsigned char *row = (unsigned char *) data + j * x * comp;
         int len;

         for (i = 0; i < x; i += len) {
            unsigned char *begin = row + i * comp;
            int diff = 1;
            len = 1;

            if (i < x - 1) {
               ++len;
               diff = memcmp(begin, row + (i + 1) * comp, comp);
               if (diff) {
                  const unsigned char *prev = begin;
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (memcmp(prev, row + k * comp, comp)) {
                        prev += comp;
                        ++len;
                     } else {
                        --len;
                        break;
                     }
                  }
               } else {
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (!memcmp(begin, row + k * comp, comp)) {
                        ++len;
                     } else {
                        break;
                     }
                  }
               }
            }

            if (diff) {
               unsigned char header = STBIW_UCHAR(len - 1);
               stbiw__write1(s, header);
               for (k = 0; k < len; ++k) {
                  stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin + k * comp);
               }
            } else {
               unsigned char header = STBIW_UCHAR(len - 129);
               stbiw__write1(s, header);
               stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin);
            }
         }
      }
      stbiw__write_flush(s);
   }
   return 1;
}